

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O2

void __thiscall
spvtools::opt::LoopDescriptor::PopulateList(LoopDescriptor *this,IRContext *context,Function *f)

{
  uint32_t *puVar1;
  pointer ppLVar2;
  IRContext *this_00;
  LoopDescriptor *pLVar3;
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Loop*>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Loop*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *p_Var4;
  NodePtr top_node;
  NodePtr pDVar5;
  bool bVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  DominatorTree *this_01;
  Instruction *this_02;
  CFG *pCVar9;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar10;
  BasicBlock *merge_target;
  BasicBlock *continue_target;
  BasicBlock *header;
  Loop *pLVar11;
  DominatorTreeNode *a;
  pointer ppLVar12;
  __normal_iterator<spvtools::opt::Loop_**,_std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>_>
  __tmp;
  uint32_t *puVar13;
  DominatorTreeNode *loop_node;
  Loop *current_loop;
  IRContext *local_318;
  LoopDescriptor *local_310;
  _Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Loop*>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Loop*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_308;
  uint32_t local_300 [2];
  Loop *local_2f8;
  PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> __begin2;
  TreeDFIterator<spvtools::opt::DominatorTreeNode> __end4;
  TreeDFIterator<spvtools::opt::DominatorTreeNode> __begin4;
  PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> __end2;
  IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::DominatorTreeNode>_> local_190;
  Loop *loop;
  PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> local_88;
  
  local_318 = context;
  this_01 = (DominatorTree *)IRContext::GetDominatorAnalysis(context,f);
  ClearLoops(this);
  DominatorTree::post_begin((post_iterator *)&local_190,this_01);
  DominatorTree::post_end(&__begin2,this_01);
  IteratorRange<spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>_>::
  IteratorRange((IteratorRange<spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>_>
                 *)&loop,(PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> *)&local_190,
                &__begin2);
  std::
  _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                  *)&__begin2.parent_iterators_);
  std::
  _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                  *)&local_190.begin_.parent_iterators_);
  PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>::PostOrderTreeDFIterator
            (&__begin2,(PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode> *)&loop);
  PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>::PostOrderTreeDFIterator
            (&__end2,&local_88);
  local_308 = (_Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Loop*>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Loop*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
               *)&this->basic_block_to_loop_;
  local_310 = this;
  do {
    top_node = __begin2.current_;
    pLVar3 = local_310;
    if (__begin2.current_ == __end2.current_) {
      std::
      _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
      ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                      *)&__end2.parent_iterators_);
      std::
      _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
      ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                      *)&__begin2.parent_iterators_);
      IteratorRange<spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>_>::
      ~IteratorRange((IteratorRange<spvtools::opt::PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>_>
                      *)&loop);
      ppLVar2 = (pLVar3->loops_).
                super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppLVar12 = (pLVar3->loops_).
                      super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                      ._M_impl.super__Vector_impl_data._M_start; ppLVar12 != ppLVar2;
          ppLVar12 = ppLVar12 + 1) {
        loop = *ppLVar12;
        if (loop->parent_ == (Loop *)0x0) {
          std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::push_back
                    (&(pLVar3->placeholder_top_loop_).nested_loops_,(value_type *)&loop);
        }
      }
      return;
    }
    this_02 = BasicBlock::GetLoopMergeInst((__begin2.current_)->bb_);
    if (this_02 != (Instruction *)0x0) {
      pCVar9 = IRContext::cfg(local_318);
      uVar7 = BasicBlock::id(top_node->bb_);
      pvVar10 = CFG::preds(pCVar9,uVar7);
      puVar1 = (pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (puVar13 = (pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start; puVar13 != puVar1;
          puVar13 = puVar13 + 1) {
        uVar7 = *puVar13;
        bVar6 = DominatorTree::ReachableFromRoots(this_01,uVar7);
        if (bVar6) {
          uVar8 = BasicBlock::id(top_node->bb_);
          bVar6 = DominatorTree::Dominates(this_01,uVar8,uVar7);
          if (!bVar6) goto LAB_0020eb66;
          uVar7 = Instruction::GetSingleWordOperand(this_02,0);
          uVar8 = Instruction::GetSingleWordOperand(this_02,1);
          this_00 = local_318;
          pCVar9 = IRContext::cfg(local_318);
          merge_target = CFG::block(pCVar9,uVar7);
          pCVar9 = IRContext::cfg(this_00);
          continue_target = CFG::block(pCVar9,uVar8);
          header = IRContext::get_instr_block(this_00,this_02);
          pLVar11 = (Loop *)operator_new(0x90);
          Loop::Loop(pLVar11,this_00,(DominatorAnalysis *)this_01,header,continue_target,
                     merge_target);
          pLVar3 = local_310;
          current_loop = pLVar11;
          std::vector<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>::push_back
                    (&local_310->loops_,&current_loop);
          ppLVar12 = (pLVar3->loops_).
                     super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1;
          while (ppLVar12 !=
                 (pLVar3->loops_).
                 super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                 _M_impl.super__Vector_impl_data._M_start) {
            pLVar11 = ppLVar12[-1];
            ppLVar12 = ppLVar12 + -1;
            if (pLVar11->parent_ == (Loop *)0x0) {
              bVar6 = DominatorAnalysisBase::Dominates
                                ((DominatorAnalysisBase *)this_01,header,pLVar11->loop_header_);
              if (bVar6) {
                bVar6 = DominatorAnalysisBase::Dominates
                                  ((DominatorAnalysisBase *)this_01,merge_target,
                                   pLVar11->loop_header_);
                if (!bVar6) {
                  Loop::AddNestedLoop(current_loop,pLVar11);
                }
              }
            }
          }
          a = DominatorTree::GetTreeNode(this_01,merge_target);
          TreeDFIterator<spvtools::opt::DominatorTreeNode>::TreeDFIterator(&__begin4,top_node);
          TreeDFIterator<spvtools::opt::DominatorTreeNode>::TreeDFIterator(&__end4);
          IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::DominatorTreeNode>_>::
          IteratorRange(&local_190,&__begin4,&__end4);
          std::
          _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
          ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                          *)&__end4.parent_iterators_);
          std::
          _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
          ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                          *)&__begin4.parent_iterators_);
          TreeDFIterator<spvtools::opt::DominatorTreeNode>::TreeDFIterator
                    (&__begin4,&local_190.begin_);
          TreeDFIterator<spvtools::opt::DominatorTreeNode>::TreeDFIterator(&__end4,&local_190.end_);
          p_Var4 = local_308;
          while (pDVar5 = __begin4.current_, __begin4.current_ != __end4.current_) {
            bVar6 = DominatorTree::Dominates(this_01,a,__begin4.current_);
            if (!bVar6) {
              Loop::AddBasicBlock(current_loop,pDVar5->bb_);
              local_300[0] = BasicBlock::id(pDVar5->bb_);
              local_2f8 = current_loop;
              std::
              _Hashtable<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Loop*>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Loop*>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              ::_M_emplace<std::pair<unsigned_int,spvtools::opt::Loop*>>(p_Var4,local_300);
            }
            TreeDFIterator<spvtools::opt::DominatorTreeNode>::MoveToNextNode(&__begin4);
          }
          std::
          _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
          ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                          *)&__end4.parent_iterators_);
          std::
          _Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
          ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::DominatorTreeNode_*,___gnu_cxx::__normal_iterator<spvtools::opt::DominatorTreeNode_**,_std::vector<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>_>_>_>_>
                          *)&__begin4.parent_iterators_);
          IteratorRange<spvtools::opt::TreeDFIterator<spvtools::opt::DominatorTreeNode>_>::
          ~IteratorRange(&local_190);
          break;
        }
LAB_0020eb66:
      }
    }
    PostOrderTreeDFIterator<spvtools::opt::DominatorTreeNode>::MoveToNextNode(&__begin2);
  } while( true );
}

Assistant:

void LoopDescriptor::PopulateList(IRContext* context, const Function* f) {
  DominatorAnalysis* dom_analysis = context->GetDominatorAnalysis(f);

  ClearLoops();

  // Post-order traversal of the dominator tree to find all the OpLoopMerge
  // instructions.
  DominatorTree& dom_tree = dom_analysis->GetDomTree();
  for (DominatorTreeNode& node :
       make_range(dom_tree.post_begin(), dom_tree.post_end())) {
    Instruction* merge_inst = node.bb_->GetLoopMergeInst();
    if (merge_inst) {
      bool all_backedge_unreachable = true;
      for (uint32_t pid : context->cfg()->preds(node.bb_->id())) {
        if (dom_analysis->IsReachable(pid) &&
            dom_analysis->Dominates(node.bb_->id(), pid)) {
          all_backedge_unreachable = false;
          break;
        }
      }
      if (all_backedge_unreachable)
        continue;  // ignore this one, we actually never branch back.

      // The id of the merge basic block of this loop.
      uint32_t merge_bb_id = merge_inst->GetSingleWordOperand(0);

      // The id of the continue basic block of this loop.
      uint32_t continue_bb_id = merge_inst->GetSingleWordOperand(1);

      // The merge target of this loop.
      BasicBlock* merge_bb = context->cfg()->block(merge_bb_id);

      // The continue target of this loop.
      BasicBlock* continue_bb = context->cfg()->block(continue_bb_id);

      // The basic block containing the merge instruction.
      BasicBlock* header_bb = context->get_instr_block(merge_inst);

      // Add the loop to the list of all the loops in the function.
      Loop* current_loop =
          new Loop(context, dom_analysis, header_bb, continue_bb, merge_bb);
      loops_.push_back(current_loop);

      // We have a bottom-up construction, so if this loop has nested-loops,
      // they are by construction at the tail of the loop list.
      for (auto itr = loops_.rbegin() + 1; itr != loops_.rend(); ++itr) {
        Loop* previous_loop = *itr;

        // If the loop already has a parent, then it has been processed.
        if (previous_loop->HasParent()) continue;

        // If the current loop does not dominates the previous loop then it is
        // not nested loop.
        if (!dom_analysis->Dominates(header_bb,
                                     previous_loop->GetHeaderBlock()))
          continue;
        // If the current loop merge dominates the previous loop then it is
        // not nested loop.
        if (dom_analysis->Dominates(merge_bb, previous_loop->GetHeaderBlock()))
          continue;

        current_loop->AddNestedLoop(previous_loop);
      }
      DominatorTreeNode* dom_merge_node = dom_tree.GetTreeNode(merge_bb);
      for (DominatorTreeNode& loop_node :
           make_range(node.df_begin(), node.df_end())) {
        // Check if we are in the loop.
        if (dom_tree.Dominates(dom_merge_node, &loop_node)) continue;
        current_loop->AddBasicBlock(loop_node.bb_);
        basic_block_to_loop_.insert(
            std::make_pair(loop_node.bb_->id(), current_loop));
      }
    }
  }
  for (Loop* loop : loops_) {
    if (!loop->HasParent()) placeholder_top_loop_.nested_loops_.push_back(loop);
  }
}